

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  uint local_8c4;
  uint i;
  uv_loop_t *loop;
  uv_work_t reqs [16];
  cancel_info ci;
  
  ci.reqs._0_4_ = 0x10;
  ci.reqs._4_4_ = 0x80;
  uVar2 = uv_default_loop();
  saturate_threadpool();
  for (local_8c4 = 0; local_8c4 < 0x10; local_8c4 = local_8c4 + 1) {
    iVar1 = uv_queue_work(uVar2,reqs[(ulong)local_8c4 - 1].work_req.wq + 1,work2_cb,done2_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x10b,"0 == uv_queue_work(loop, reqs + i, work2_cb, done2_cb)");
      abort();
    }
  }
  iVar1 = uv_timer_init(uVar2,&ci.nreqs);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x10d,"0 == uv_timer_init(loop, &ci.timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start(&ci.nreqs,timer_cb,10,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x10e,"0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0)");
    abort();
  }
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x10f,"0 == uv_run(loop, UV_RUN_DEFAULT)");
    abort();
  }
  if (timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x110,"1 == timer_cb_called");
    abort();
  }
  if (done2_cb_called != 0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x111,"ARRAY_SIZE(reqs) == done2_cb_called");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
            ,0x113,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT(0 == uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(ARRAY_SIZE(reqs) == done2_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}